

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  Type type;
  value_type expression_text;
  key_type *key;
  value_type this_00;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  AssertionResult *this_02;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  StringIO stringio;
  string stringbuf;
  int i;
  TypeParam ht_out;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb08;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  hasher *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  Type in_stack_fffffffffffffb3c;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb40;
  key_type *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  char *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  char *in_stack_fffffffffffffb80;
  undefined6 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8e;
  undefined1 in_stack_fffffffffffffb8f;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb90;
  string *s;
  string local_428 [48];
  key_type local_3f8;
  undefined1 local_3f1;
  AssertionResult local_3f0;
  string local_3e0 [48];
  key_type local_3b0;
  undefined1 local_3a9;
  AssertionResult local_3a8 [2];
  Type local_384;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_380;
  value_type local_360;
  AssertionResult local_358;
  string local_348 [48];
  key_type local_318;
  undefined1 local_311;
  AssertionResult local_310 [2];
  key_type local_2ec;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2e8;
  value_type local_2c8;
  AssertionResult local_2c0 [2];
  key_type local_29c;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_298;
  value_type local_278;
  AssertionResult local_270;
  string local_260 [55];
  undefined1 local_229;
  AssertionResult local_228;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_218;
  Hasher local_208;
  Hasher local_1fc;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_1f0;
  string local_170 [55];
  undefined1 local_139;
  AssertionResult local_138;
  StringIO local_128;
  string local_120;
  key_type local_100;
  key_type local_fc;
  value_type local_cc;
  int local_c4;
  key_type local_c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_88;
  
  bVar1 = google::
          HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    Hasher::Hasher(&local_94,0);
    Hasher::Hasher(&local_a0,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashMap
              (in_stack_fffffffffffffb40,
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30,
               (key_equal *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (allocator_type *)in_stack_fffffffffffffb20);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
    local_c0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
    for (local_c4 = 1; local_c4 < 100; local_c4 = local_c4 + 1) {
      local_cc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(in_stack_fffffffffffffb08,0);
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffb90,
               (value_type *)
               CONCAT17(in_stack_fffffffffffffb8f,
                        CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)));
    }
    local_fc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
    local_100 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
    s = &local_120;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_128,s);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,StringIO>
                      (&local_88,&local_128);
    local_139 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xf7b17a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)),
                 in_stack_fffffffffffffb80,
                 (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 (char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                 (char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)s,
                 (Message *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_170);
      testing::Message::~Message((Message *)0xf7b256);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7b2ed);
    Hasher::Hasher(&local_1fc,0);
    Hasher::Hasher(&local_208,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_218,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashMap
              (in_stack_fffffffffffffb40,
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30,
               (key_equal *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (allocator_type *)in_stack_fffffffffffffb20);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_218);
    uVar3 = google::
            BaseHashtableInterface<google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,StringIO>
                      (&local_1f0,&local_128);
    local_229 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xf7b3a1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)),
                 in_stack_fffffffffffffb80,
                 (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 (char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                 (char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)s,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_260);
      testing::Message::~Message((Message *)0xf7b4b5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7b54c);
    expression_text =
         HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffffb08,0);
    local_278 = expression_text;
    kVar4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_29c = kVar4;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
           in_stack_fffffffffffffb48);
    google::
    dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_298);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)
               ,(pair<const_int,_int> *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb70 =
           testing::AssertionResult::failure_message((AssertionResult *)0xf7b62f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 (char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                 (char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)s,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xf7b68c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7b6fd);
    local_2c8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffb08,0);
    local_2ec = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
           in_stack_fffffffffffffb48);
    google::
    dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_2e8);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)
               ,(pair<const_int,_int> *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xf7b7e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 (char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                 (char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)s,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xf7b83d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7b8ae);
    kVar5 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_318 = kVar5;
    key = (key_type *)
          google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::count(in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
    local_311 = key == (key_type *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xf7b916);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)),
                 (char *)expression_text,(char *)CONCAT44(kVar4,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 (char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                 (char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)s,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_348);
      testing::Message::~Message((Message *)0xf7b9eb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7ba82);
    this_00 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb08,0);
    local_360 = this_00;
    type = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_384 = type;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(kVar5,in_stack_fffffffffffffb50),key);
    google::
    dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_380);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)
               ,(pair<const_int,_int> *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffb30 =
           (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xf7bb65);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffb30,
                 in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)s,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xf7bbc2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7bc33);
    kVar5 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_3b0 = kVar5;
    this_01 = (HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)google::
                 BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::count(in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
    local_3a9 = this_01 ==
                (HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xf7bc9b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a8);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)),
                 (char *)expression_text,(char *)CONCAT44(kVar4,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffb30,kVar5,
                 (char *)this_01);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)s,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_3e0);
      testing::Message::~Message((Message *)0xf7bd70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7be07);
    local_3f8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(this_01,in_stack_fffffffffffffb1c);
    this_02 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
    local_3f1 = this_02 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_02,(bool *)in_stack_fffffffffffffb08,(type *)0xf7be6f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)),
                 (char *)expression_text,(char *)CONCAT44(kVar4,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffb30,kVar5,
                 (char *)this_01);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)s,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
      std::__cxx11::string::~string(local_428);
      testing::Message::~Message((Message *)0xf7bf44);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7bfd8);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf7bfe5);
    std::__cxx11::string::~string((string *)&local_120);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf7bfff);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToString) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  string stringbuf;
  StringIO stringio(&stringbuf);
  EXPECT_TRUE(
      ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));

  TypeParam ht_in;
  EXPECT_TRUE(
      ht_in.unserialize(typename TypeParam::NopointerSerializer(), &stringio));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}